

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::CanProveConditionalBranch
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Var src1Var,Var src2Var,
          bool *result)

{
  uint uVar1;
  ValueInfo *pVVar2;
  ulong uVar3;
  bool bVar4;
  ObjectType OVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 uVar7;
  Func *pFVar8;
  ValueType *pVVar9;
  ValueType *pVVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  double value;
  ulong local_48;
  int64 right64;
  int64 left64;
  int32 left;
  int32 right;
  
  bVar4 = false;
  switch(instr->m_opcode) {
  case BrNotEq_A:
switchD_0045aa70_caseD_194:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
        bVar4 = (uint)left64 == left64._4_4_;
        goto LAB_0045bc54;
      }
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                         (Value *)&DAT_00000001,(bool)uVar7);
      if (bVar4) goto LAB_0045b9a2;
    }
    if (src1Var == (Var)0x0 || src2Var == (Var)0x0) {
      bVar4 = anon_unknown.dwarf_e9f255::BoolAndIntStaticAndTypeMismatch
                        ((Value *)src1Val->valueInfo,(Value *)src2Val->valueInfo,src1Var,src2Var);
LAB_0045bad6:
      bVar11 = true;
      if (bVar4 != false) break;
    }
    else {
      pFVar8 = this->func;
      bVar4 = false;
LAB_0045b9cc:
      bVar4 = anon_unknown.dwarf_e9f255::Op_JitEq
                        (result,src1Val,src2Val,src1Var,src2Var,pFVar8,bVar4);
      if (bVar4) {
        bVar11 = *result;
        goto LAB_0045b9ef;
      }
    }
    goto LAB_0045bd17;
  case BrNotNeq_A:
switchD_0045aa70_caseD_195:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
        bVar11 = (uint)left64 == left64._4_4_;
      }
      else {
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                           (Value *)&DAT_00000001,(bool)uVar7);
        bVar11 = true;
        if (!bVar4) goto LAB_0045ba1c;
      }
      break;
    }
LAB_0045ba1c:
    if (src1Var == (Var)0x0 || src2Var == (Var)0x0) {
      bVar4 = anon_unknown.dwarf_e9f255::BoolAndIntStaticAndTypeMismatch
                        ((Value *)src1Val->valueInfo,(Value *)src2Val->valueInfo,src1Var,src2Var);
      goto LAB_0045ba87;
    }
    pFVar8 = this->func;
    bVar4 = false;
LAB_0045ba3a:
    bVar4 = anon_unknown.dwarf_e9f255::Op_JitEq(result,src1Val,src2Val,src1Var,src2Var,pFVar8,bVar4)
    ;
    if (!bVar4) goto LAB_0045bd17;
    goto LAB_0045bc5f;
  case BrSrNotEq_A:
switchD_0045aa70_caseD_196:
    if (src1Var != (Var)0x0 && src2Var != (Var)0x0) {
      pFVar8 = this->func;
      bVar4 = true;
      goto LAB_0045b9cc;
    }
    pVVar2 = src2Val->valueInfo;
    pVVar9 = &src1Val->valueInfo->super_ValueType;
    bVar4 = ValueType::IsUndefined(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if (bVar4) {
        bVar4 = ValueType::HasBeenUndefined(&pVVar2->super_ValueType);
        bVar11 = true;
        if (!bVar4) break;
      }
    }
    bVar4 = ValueType::IsNull(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if (bVar4) {
        bVar4 = ValueType::HasBeenNull(&pVVar2->super_ValueType);
        bVar11 = true;
        if (!bVar4) break;
      }
    }
    bVar4 = ValueType::IsBoolean(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if (bVar4) {
        bVar4 = ValueType::HasBeenBoolean(&pVVar2->super_ValueType);
        bVar11 = true;
        if (!bVar4) break;
      }
    }
    bVar4 = ValueType::IsNumber(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if (bVar4) {
        bVar4 = ValueType::HasBeenNumber(&pVVar2->super_ValueType);
        bVar11 = true;
        if (!bVar4) break;
      }
    }
    bVar4 = ValueType::IsString(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if (bVar4) {
        bVar4 = ValueType::HasBeenString(&pVVar2->super_ValueType);
        bVar11 = true;
        if (!bVar4) break;
      }
    }
    pVVar10 = &pVVar2->super_ValueType;
    bVar4 = ValueType::IsUndefined(pVVar10);
    if ((bVar4) && (bVar4 = ValueType::IsDefinite(pVVar9), bVar4)) {
      bVar4 = ValueType::HasBeenUndefined(pVVar9);
      bVar11 = true;
      if (!bVar4) break;
    }
    bVar4 = ValueType::IsNull(pVVar10);
    if ((bVar4) && (bVar4 = ValueType::IsDefinite(pVVar9), bVar4)) {
      bVar4 = ValueType::HasBeenNull(pVVar9);
      bVar11 = true;
      if (!bVar4) break;
    }
    bVar4 = ValueType::IsBoolean(pVVar10);
    if ((bVar4) && (bVar4 = ValueType::IsDefinite(pVVar9), bVar4)) {
      bVar4 = ValueType::HasBeenBoolean(pVVar9);
      bVar11 = true;
      if (!bVar4) break;
    }
    bVar4 = ValueType::IsNumber(pVVar10);
    if ((bVar4) && (bVar4 = ValueType::IsDefinite(pVVar9), bVar4)) {
      bVar4 = ValueType::HasBeenNumber(pVVar9);
      bVar11 = true;
      if (!bVar4) break;
    }
    bVar4 = ValueType::IsString(pVVar10);
    if ((bVar4) && (bVar4 = ValueType::IsDefinite(pVVar9), bVar4)) {
      bVar4 = ValueType::HasBeenString(pVVar9);
      bVar11 = true;
      if (!bVar4) break;
    }
    bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                       (Value *)&DAT_00000001,SUB81(src2Val,0));
LAB_0045ba87:
    bVar11 = false;
LAB_0045ba8d:
    if (bVar4 == false) {
      return false;
    }
    break;
  case BrSrNotNeq_A:
switchD_0045aa70_caseD_197:
    uVar7 = src2Var != (Var)0x0;
    if (src1Var != (Var)0x0 && (bool)uVar7) {
      pFVar8 = this->func;
      bVar4 = true;
      goto LAB_0045ba3a;
    }
    pVVar2 = src2Val->valueInfo;
    pVVar9 = &src1Val->valueInfo->super_ValueType;
    bVar4 = ValueType::IsUndefined(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if ((bVar4) && (bVar4 = ValueType::HasBeenUndefined(&pVVar2->super_ValueType), !bVar4))
      goto LAB_0045b9a2;
    }
    bVar4 = ValueType::IsNull(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if ((bVar4) && (bVar4 = ValueType::HasBeenNull(&pVVar2->super_ValueType), !bVar4))
      goto LAB_0045b9a2;
    }
    bVar4 = ValueType::IsBoolean(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if ((bVar4) && (bVar4 = ValueType::HasBeenBoolean(&pVVar2->super_ValueType), !bVar4))
      goto LAB_0045b9a2;
    }
    bVar4 = ValueType::IsNumber(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if ((bVar4) && (bVar4 = ValueType::HasBeenNumber(&pVVar2->super_ValueType), !bVar4))
      goto LAB_0045b9a2;
    }
    bVar4 = ValueType::IsString(pVVar9);
    if (bVar4) {
      bVar4 = ValueType::IsDefinite(&pVVar2->super_ValueType);
      if ((bVar4) && (bVar4 = ValueType::HasBeenString(&pVVar2->super_ValueType), !bVar4))
      goto LAB_0045b9a2;
    }
    pVVar10 = &pVVar2->super_ValueType;
    bVar4 = ValueType::IsUndefined(pVVar10);
    if ((((((!bVar4) ||
           ((bVar4 = ValueType::IsDefinite(pVVar9), !bVar4 ||
            (bVar4 = ValueType::HasBeenUndefined(pVVar9), bVar4)))) &&
          ((bVar4 = ValueType::IsNull(pVVar10), !bVar4 ||
           ((bVar4 = ValueType::IsDefinite(pVVar9), !bVar4 ||
            (bVar4 = ValueType::HasBeenNull(pVVar9), bVar4)))))) &&
         ((bVar4 = ValueType::IsBoolean(pVVar10), !bVar4 ||
          ((bVar4 = ValueType::IsDefinite(pVVar9), !bVar4 ||
           (bVar4 = ValueType::HasBeenBoolean(pVVar9), bVar4)))))) &&
        ((bVar4 = ValueType::IsNumber(pVVar10), !bVar4 ||
         ((bVar4 = ValueType::IsDefinite(pVVar9), !bVar4 ||
          (bVar4 = ValueType::HasBeenNumber(pVVar9), bVar4)))))) &&
       ((bVar4 = ValueType::IsString(pVVar10), !bVar4 ||
        ((bVar4 = ValueType::IsDefinite(pVVar9), !bVar4 ||
         (bVar4 = ValueType::HasBeenString(pVVar9), bVar4)))))) {
      uVar1 = src2Val->valueNumber;
      goto LAB_0045bacc;
    }
LAB_0045b9a2:
    bVar11 = false;
    break;
  case BrNotGe_A:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
LAB_0045b93a:
        bVar12 = SBORROW4((uint)left64,left64._4_4_);
        bVar4 = (int)((uint)left64 - left64._4_4_) < 0;
        goto LAB_0045b940;
      }
      bVar11 = false;
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                         (Value *)0x0,(bool)uVar7);
      if (bVar4) break;
    }
    if ((src2Var == (Var)0x0 || src1Var == (Var)0x0) || (DAT_015a4e7e != '\x01')) goto LAB_0045bd17;
    iVar6 = Js::JavascriptOperators::GreaterEqual
                      (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
LAB_0045afe3:
    bVar11 = iVar6 == 0;
    break;
  case BrNotGt_A:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
LAB_0045b8e0:
        bVar13 = SBORROW4((uint)left64,left64._4_4_);
        bVar12 = (int)((uint)left64 - left64._4_4_) < 0;
        bVar4 = (uint)left64 == left64._4_4_;
        goto LAB_0045b8e6;
      }
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                         (Value *)0x0,(bool)uVar7);
      bVar11 = true;
      if (bVar4) break;
    }
    if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015a4e7e == '\x01')) {
      iVar6 = Js::JavascriptOperators::Greater
                        (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
      goto LAB_0045afe3;
    }
    goto LAB_0045bd17;
  case BrNotLt_A:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
LAB_0045afa5:
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015a4e7e == '\x01')) {
        iVar6 = Js::JavascriptOperators::Less
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_0045afe3;
      }
      goto LAB_0045bd17;
    }
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
LAB_0045b82c:
      bVar12 = SBORROW4((uint)left64,left64._4_4_);
      bVar4 = (int)((uint)left64 - left64._4_4_) < 0;
LAB_0045b832:
      bVar11 = bVar12 == bVar4;
    }
    else {
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                         (Value *)0x0,(bool)uVar7);
      bVar11 = true;
      if (!bVar4) goto LAB_0045afa5;
    }
    break;
  case BrNotLe_A:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
LAB_0045ae63:
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015a4e7e == '\x01')) {
        iVar6 = Js::JavascriptOperators::LessEqual
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_0045afe3;
      }
      goto LAB_0045bd17;
    }
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
LAB_0045b886:
      bVar13 = SBORROW4((uint)left64,left64._4_4_);
      bVar12 = (int)((uint)left64 - left64._4_4_) < 0;
      bVar4 = (uint)left64 == left64._4_4_;
LAB_0045b88c:
      bVar11 = !bVar4 && bVar13 == bVar12;
    }
    else {
      bVar11 = false;
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                         (Value *)0x0,(bool)uVar7);
      if (!bVar4) goto LAB_0045ae63;
    }
    break;
  case BrNotAddr_A:
  case BrAddr_A:
  case BrOnException:
  case BrOnNoException:
  case DeadBrEqual:
  case DeadBrSrEqual:
  case DeadBrRelational:
  case DeadBrOnHasProperty:
  case DeletedNonHelperBranch:
  case BrTrue_I4:
    goto switchD_0045aa70_caseD_19c;
  case BrEq_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
        *result = (uint)left64 == left64._4_4_;
      }
      bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
         bVar4)) {
        bVar11 = CONCAT44(right64._4_4_,(int)right64) == local_48;
        break;
      }
      uVar1 = src2Val->valueNumber;
LAB_0045bacc:
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)uVar1,
                         (Value *)&DAT_00000001,(bool)uVar7);
      goto LAB_0045bad6;
    }
    goto LAB_0045bd17;
  case BrFalse_I4:
    right64._0_4_ = 0;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&right64,false);
    if (!bVar4) {
      return false;
    }
    bVar11 = (int)right64 == 0;
    break;
  case BrGe_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
        *result = (int)left64._4_4_ <= (int)(uint)left64;
      }
      bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
         bVar4)) {
        bVar12 = SBORROW8(CONCAT44(right64._4_4_,(int)right64),local_48);
        bVar4 = (long)(CONCAT44(right64._4_4_,(int)right64) - local_48) < 0;
        goto LAB_0045b832;
      }
LAB_0045b2aa:
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                         (Value *)0x0,(bool)uVar7);
      bVar11 = true;
      goto LAB_0045ba8d;
    }
    goto LAB_0045bd17;
  case BrUnGe_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_0045bd17;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar4)) {
      *result = left64._4_4_ <= (uint)left64;
    }
    bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar4) ||
       (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar4)) goto LAB_0045b2aa;
    bVar11 = local_48 <= CONCAT44(right64._4_4_,(int)right64);
    break;
  case BrGt_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
      bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetIntConstantValue
                            (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
        *result = (int)left64._4_4_ < (int)(uint)left64;
      }
      bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
      if ((bVar4) &&
         (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
         bVar4)) {
        uVar3 = CONCAT44(right64._4_4_,(int)right64);
        bVar13 = SBORROW8(uVar3,local_48);
        bVar12 = (long)(uVar3 - local_48) < 0;
        bVar4 = uVar3 == local_48;
        goto LAB_0045b88c;
      }
LAB_0045b407:
      bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                         (Value *)0x0,(bool)uVar7);
      goto LAB_0045ba87;
    }
    goto LAB_0045bd17;
  case BrUnGt_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_0045bd17;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar4)) {
      *result = left64._4_4_ < (uint)left64;
    }
    bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar4) ||
       (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar4)) goto LAB_0045b407;
    bVar11 = local_48 < CONCAT44(right64._4_4_,(int)right64);
    break;
  case BrLt_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_0045bd17;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
      *result = (int)(uint)left64 < (int)left64._4_4_;
    }
    bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((!bVar4) ||
       (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
       !bVar4)) goto LAB_0045b407;
    bVar12 = SBORROW8(CONCAT44(right64._4_4_,(int)right64),local_48);
    bVar4 = (long)(CONCAT44(right64._4_4_,(int)right64) - local_48) < 0;
LAB_0045b940:
    bVar11 = bVar12 != bVar4;
    break;
  case BrUnLt_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_0045bd17;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar4)) {
      *result = (uint)left64 < left64._4_4_;
    }
    bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar4) ||
       (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar4)) goto LAB_0045b407;
    bVar11 = CONCAT44(right64._4_4_,(int)right64) < local_48;
    break;
  case BrLe_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_0045bd17;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
      *result = (int)(uint)left64 <= (int)left64._4_4_;
    }
    bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((!bVar4) ||
       (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
       !bVar4)) goto LAB_0045b2aa;
    uVar3 = CONCAT44(right64._4_4_,(int)right64);
    bVar13 = SBORROW8(uVar3,local_48);
    bVar12 = (long)(uVar3 - local_48) < 0;
    bVar4 = uVar3 == local_48;
LAB_0045b8e6:
    bVar11 = bVar4 || bVar13 != bVar12;
    break;
  case BrUnLe_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_0045bd17;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,true);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),true), bVar4)) {
      *result = (uint)left64 <= left64._4_4_;
    }
    bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,true);
    if ((!bVar4) ||
       (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,true),
       !bVar4)) goto LAB_0045b2aa;
    bVar11 = CONCAT44(right64._4_4_,(int)right64) <= local_48;
    break;
  case BrNeq_I4:
    uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) goto LAB_0045bd17;
    bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
    if ((bVar4) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue
                          (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4)) {
      *result = (uint)left64 != left64._4_4_;
    }
    bVar4 = ValueInfo::TryGetInt64ConstantValue(src1Val->valueInfo,&right64,false);
    if ((!bVar4) ||
       (bVar4 = ValueInfo::TryGetInt64ConstantValue(src2Val->valueInfo,(int64 *)&local_48,false),
       !bVar4)) goto LAB_0045b407;
    bVar4 = CONCAT44(right64._4_4_,(int)right64) == local_48;
LAB_0045bc54:
    bVar11 = !bVar4;
    break;
  default:
    switch(instr->m_opcode) {
    case BrEq_A:
      goto switchD_0045aa70_caseD_195;
    case BrNeq_A:
      goto switchD_0045aa70_caseD_194;
    case BrFalse_A:
    case BrTrue_A:
      pVVar9 = &src1Val->valueInfo->super_ValueType;
      bVar4 = ValueType::IsNull(pVVar9);
      if ((bVar4) || (bVar4 = ValueType::IsUndefined(pVVar9), bVar4)) {
        bVar11 = instr->m_opcode == BrFalse_A;
        goto LAB_0045bc58;
      }
      bVar4 = ValueType::IsObject(pVVar9);
      if ((bVar4) && (OVar5 = ValueType::GetObjectType(pVVar9), Object < OVar5)) {
        bVar11 = instr->m_opcode == BrTrue_A;
        goto LAB_0045bc58;
      }
      if (src1Var == (Var)0x0) break;
      iVar6 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
      if ((Var)CONCAT44(extraout_var,iVar6) == src1Var) {
        bVar11 = true;
      }
      else {
        iVar6 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
        if ((Var)CONCAT44(extraout_var_00,iVar6) == src1Var) {
          bVar11 = false;
        }
        else {
          bVar4 = Js::TaggedInt::Is(src1Var);
          if (bVar4) {
            bVar11 = (undefined1 *)src1Var != &DAT_1000000000000;
          }
          else {
            if ((ulong)src1Var >> 0x32 == 0) break;
            value = Js::JavascriptNumber::GetValue(src1Var);
            bVar4 = Js::NumberUtilities::IsNan(value);
            bVar11 = value != 0.0 && !bVar4;
          }
        }
      }
      *result = (bool)bVar11;
      if (instr->m_opcode != BrFalse_A) goto LAB_0045bc5f;
LAB_0045b9ef:
      bVar11 = bVar11 ^ 1;
      goto LAB_0045bc58;
    case BrGe_A:
      uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar4) &&
           (bVar4 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4))
        goto LAB_0045b82c;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                           (Value *)0x0,(bool)uVar7);
        bVar11 = true;
        if (bVar4) goto LAB_0045bc58;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015a4e7e == '\x01')) {
        iVar6 = Js::JavascriptOperators::GreaterEqual
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
LAB_0045bc52:
        bVar4 = iVar6 == 0;
        goto LAB_0045bc54;
      }
      break;
    case BrGt_A:
      uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar4) &&
           (bVar4 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4))
        goto LAB_0045b886;
        bVar11 = false;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                           (Value *)0x0,(bool)uVar7);
        if (bVar4) goto LAB_0045bc58;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015a4e7e == '\x01')) {
        iVar6 = Js::JavascriptOperators::Greater
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_0045bc52;
      }
      break;
    case BrLt_A:
      uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar4) &&
           (bVar4 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4))
        goto LAB_0045b93a;
        bVar11 = false;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                           (Value *)0x0,(bool)uVar7);
        if (bVar4) goto LAB_0045bc58;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015a4e7e == '\x01')) {
        iVar6 = Js::JavascriptOperators::Less
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_0045bc52;
      }
      break;
    case BrLe_A:
      uVar7 = src2Val == (Value *)0x0 || src1Val == (Value *)0x0;
      if (src2Val != (Value *)0x0 && src1Val != (Value *)0x0) {
        bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,(int32 *)&left64,false);
        if ((bVar4) &&
           (bVar4 = ValueInfo::TryGetIntConstantValue
                              (src2Val->valueInfo,(int32 *)((long)&left64 + 4),false), bVar4))
        goto LAB_0045b8e0;
        bVar4 = CanProveConditionalBranch::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)src1Val,(Value *)(ulong)src2Val->valueNumber,
                           (Value *)0x0,(bool)uVar7);
        bVar11 = true;
        if (bVar4) goto LAB_0045bc58;
      }
      if ((src2Var != (Var)0x0 && src1Var != (Var)0x0) && (DAT_015a4e7e == '\x01')) {
        iVar6 = Js::JavascriptOperators::LessEqual
                          (src1Var,src2Var,(ScriptContext *)this->func->m_scriptContextInfo);
        goto LAB_0045bc52;
      }
      break;
    case BrSrEq_A:
      goto switchD_0045aa70_caseD_197;
    case BrSrNeq_A:
      goto switchD_0045aa70_caseD_196;
    default:
      goto switchD_0045aa70_caseD_19c;
    case BrOnObject_A:
      pVVar9 = &src1Val->valueInfo->super_ValueType;
      bVar4 = ValueType::IsDefinite(pVVar9);
      if (!bVar4) break;
      bVar4 = ValueType::IsPrimitive(pVVar9);
      if (!bVar4) {
        bVar4 = ValueType::HasBeenPrimitive(pVVar9);
        bVar11 = true;
        if (!bVar4) goto LAB_0045bc58;
        break;
      }
      goto LAB_0045b9a2;
    }
LAB_0045bd17:
    bVar4 = false;
    goto switchD_0045aa70_caseD_19c;
  }
LAB_0045bc58:
  *result = (bool)bVar11;
LAB_0045bc5f:
  bVar4 = true;
switchD_0045aa70_caseD_19c:
  return bVar4;
}

Assistant:

bool
GlobOpt::CanProveConditionalBranch(IR::Instr *instr, Value *src1Val, Value *src2Val, Js::Var src1Var, Js::Var src2Var, bool *result)
{
    auto AreSourcesEqual = [&](Value * val1, Value * val2, bool undefinedCmp) -> bool
    {
        // NaN !== NaN, and objects can have valueOf/toString
        if (val1->IsEqualTo(val2))
        {
            if (val1->GetValueInfo()->IsUndefined())
            {
                return undefinedCmp;
            }
            ValueInfo * valInfo = val1->GetValueInfo();
            return !valInfo->HasBeenUndefined() && valInfo->IsPrimitive() && valInfo->IsNotFloat();
        }
        return false;
    };

    // Make sure GetConstantVar only returns primitives.
    // TODO: OOP JIT, enabled these asserts
    //Assert(!src1Var || !Js::JavascriptOperators::IsObject(src1Var));
    //Assert(!src2Var || !Js::JavascriptOperators::IsObject(src2Var));

    int64 left64, right64;
    int32 left, right;
    int32 constVal;

    switch (instr->m_opcode)
    {
#define BRANCHSIGNED(OPCODE,CMP,TYPE,UNSIGNEDNESS,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val) \
        { \
            if (src1Val->GetValueInfo()->TryGetIntConstantValue(&left, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetIntConstantValue(&right, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left CMP(TYPE)right; \
            } \
            if (src1Val->GetValueInfo()->TryGetInt64ConstantValue(&left64, UNSIGNEDNESS) && \
                src2Val->GetValueInfo()->TryGetInt64ConstantValue(&right64, UNSIGNEDNESS)) \
            { \
                *result = (TYPE)left64 CMP(TYPE)right64; \
            } \
            else if (AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
            { \
                *result = 0 CMP 0; \
            } \
            else \
            { \
                return false; \
            } \
        } \
        else \
        { \
            return false; \
        } \
        break;

        BRANCHSIGNED(BrEq_I4, == , int64, false, true)
        BRANCHSIGNED(BrGe_I4, >= , int64, false, false)
        BRANCHSIGNED(BrGt_I4, > , int64, false, false)
        BRANCHSIGNED(BrLt_I4, < , int64, false, false)
        BRANCHSIGNED(BrLe_I4, <= , int64, false, false)
        BRANCHSIGNED(BrNeq_I4, != , int64, false, false)
        BRANCHSIGNED(BrUnGe_I4, >= , uint64, true, false)
        BRANCHSIGNED(BrUnGt_I4, > , uint64, true, false)
        BRANCHSIGNED(BrUnLt_I4, < , uint64, true, false)
        BRANCHSIGNED(BrUnLe_I4, <= , uint64, true, false)
#undef BRANCHSIGNED
#define BRANCH(OPCODE,CMP,VARCMPFUNC,UNDEFINEDCMP) \
    case Js::OpCode::##OPCODE: \
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) && \
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right)) \
        { \
            *result = left CMP right; \
        } \
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, UNDEFINEDCMP)) \
        { \
            *result = 0 CMP 0; \
        } \
        else if (src1Var && src2Var) \
        { \
            if (func->IsOOPJIT() || !CONFIG_FLAG(OOPJITMissingOpts)) \
            { \
                return false; \
            } \
            *result = VARCMPFUNC(src1Var, src2Var, this->func->GetScriptContext()); \
        } \
        else \
        { \
            return false; \
        } \
        break;

    BRANCH(BrGe_A, >= , Js::JavascriptOperators::GreaterEqual, /*undefinedEquality*/ false)
    BRANCH(BrNotGe_A, <, !Js::JavascriptOperators::GreaterEqual, false)
    BRANCH(BrLt_A, <, Js::JavascriptOperators::Less, false)
    BRANCH(BrNotLt_A, >= , !Js::JavascriptOperators::Less, false)
    BRANCH(BrGt_A, >, Js::JavascriptOperators::Greater, false)
    BRANCH(BrNotGt_A, <= , !Js::JavascriptOperators::Greater, false)
    BRANCH(BrLe_A, <= , Js::JavascriptOperators::LessEqual, false)
    BRANCH(BrNotLe_A, >, !Js::JavascriptOperators::LessEqual, false)
#undef BRANCH
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left == right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = true;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
        if (src1Val && src2Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&left) &&
            src2Val->GetValueInfo()->TryGetIntConstantValue(&right))
        {
            *result = left != right;
        }
        else if (src1Val && src2Val && AreSourcesEqual(src1Val, src2Val, true))
        {
            *result = false;
        }
        else if (!src1Var || !src2Var)
        {
            if (BoolAndIntStaticAndTypeMismatch(src1Val, src2Val, src1Var, src2Var))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, false /* isStrict */))
            {
                return false;
            }
        }
        break;
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = false;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitEq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
        if (!src1Var || !src2Var)
        {
            ValueInfo *src1ValInfo = src1Val->GetValueInfo();
            ValueInfo *src2ValInfo = src2Val->GetValueInfo();
            if (
                (src1ValInfo->IsUndefined() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenUndefined()) ||
                (src1ValInfo->IsNull() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNull()) ||
                (src1ValInfo->IsBoolean() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenBoolean()) ||
                (src1ValInfo->IsNumber() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenNumber()) ||
                (src1ValInfo->IsString() && src2ValInfo->IsDefinite() && !src2ValInfo->HasBeenString()) ||

                (src2ValInfo->IsUndefined() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenUndefined()) ||
                (src2ValInfo->IsNull() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNull()) ||
                (src2ValInfo->IsBoolean() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenBoolean()) ||
                (src2ValInfo->IsNumber() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenNumber()) ||
                (src2ValInfo->IsString() && src1ValInfo->IsDefinite() && !src1ValInfo->HasBeenString())
                )
            {
                *result = true;
            }
            else if (AreSourcesEqual(src1Val, src2Val, true))
            {
                *result = false;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if (!Op_JitNeq(result, src1Val, src2Val, src1Var, src2Var, this->func, true /* isStrict */))
            {
                return false;
            }
        }
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (src1ValueInfo->IsNull() || src1ValueInfo->IsUndefined())
        {
            *result = instr->m_opcode == Js::OpCode::BrFalse_A;
            break;
        }
        if (src1ValueInfo->IsObject() && src1ValueInfo->GetObjectType() > ObjectType::Object)
        {
            // Specific object types that are tracked are equivalent to 'true'
            *result = instr->m_opcode == Js::OpCode::BrTrue_A;
            break;
        }

        if (!src1Var)
        {
            return false;
        }

        // Set *result = (evaluates true) and negate it later for BrFalse
        if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetTrueAddr()))
        {
            *result = true;
        }
        else if (src1Var == reinterpret_cast<Js::Var>(this->func->GetScriptContextInfo()->GetFalseAddr()))
        {
            *result = false;
        }
        else if (Js::TaggedInt::Is(src1Var))
        {
            *result = (src1Var != reinterpret_cast<Js::Var>(Js::AtomTag_IntPtr));
        }
#if FLOATVAR
        else if (Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var))
        {
            double value = Js::JavascriptNumber::GetValue(src1Var);
            *result = (!Js::JavascriptNumber::IsNan(value)) && (!Js::JavascriptNumber::IsZero(value));
        }
#endif
        else
        {
            return false;
        }

        if (instr->m_opcode == Js::OpCode::BrFalse_A)
        {
            *result = !(*result);
        }
        break;
    }
    case Js::OpCode::BrFalse_I4:
    {
        constVal = 0;
        if (!src1Val->GetValueInfo()->TryGetIntConstantValue(&constVal))
        {
            return false;
        }

        *result = constVal == 0;
        break;
    }
    case Js::OpCode::BrOnObject_A:
    {
        ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
        if (!src1ValueInfo->IsDefinite())
        {
            return false;
        }

        if (src1ValueInfo->IsPrimitive())
        {
            *result = false;
        }
        else
        {
            if (src1ValueInfo->HasBeenPrimitive())
            {
                return false;
            }
            *result = true;
        }

        break;
    }
    default:
        return false;
    }
    return true;
}